

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

VariablePatternSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::VariablePatternSyntax,slang::syntax::VariablePatternSyntax_const&>
          (BumpAllocator *this,VariablePatternSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  undefined4 uVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  VariablePatternSyntax *pVVar13;
  
  pVVar13 = (VariablePatternSyntax *)allocate(this,0x38,8);
  uVar4 = *(undefined4 *)&(args->super_PatternSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PatternSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_PatternSyntax).super_SyntaxNode.previewNode;
  TVar5 = (args->dot).kind;
  uVar6 = (args->dot).field_0x2;
  NVar7.raw = (args->dot).numFlags.raw;
  uVar8 = (args->dot).rawLen;
  pIVar3 = (args->dot).info;
  TVar9 = (args->variableName).kind;
  uVar10 = (args->variableName).field_0x2;
  NVar11.raw = (args->variableName).numFlags.raw;
  uVar12 = (args->variableName).rawLen;
  (pVVar13->super_PatternSyntax).super_SyntaxNode.kind =
       (args->super_PatternSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pVVar13->super_PatternSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pVVar13->super_PatternSyntax).super_SyntaxNode.parent = pSVar1;
  (pVVar13->super_PatternSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pVVar13->dot).kind = TVar5;
  (pVVar13->dot).field_0x2 = uVar6;
  (pVVar13->dot).numFlags = (NumericTokenFlags)NVar7.raw;
  (pVVar13->dot).rawLen = uVar8;
  (pVVar13->dot).info = pIVar3;
  (pVVar13->variableName).kind = TVar9;
  (pVVar13->variableName).field_0x2 = uVar10;
  (pVVar13->variableName).numFlags = (NumericTokenFlags)NVar11.raw;
  (pVVar13->variableName).rawLen = uVar12;
  (pVVar13->variableName).info = (args->variableName).info;
  return pVVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }